

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

curl_off_t Curl_mime_size(curl_mimepart *part)

{
  curl_off_t cVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  size_t in_RCX;
  long lVar5;
  curl_mimepart *part_00;
  
  if (part->kind == MIMEKIND_MULTIPART) {
    part_00 = (curl_mimepart *)part->arg;
    if (part_00 == (curl_mimepart *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = 0x2e;
      while (part_00 = part_00->nextpart, part_00 != (curl_mimepart *)0x0) {
        cVar1 = Curl_mime_size(part_00);
        if (cVar1 < 0) {
          lVar5 = cVar1;
        }
        if (lVar5 < 0) {
          lVar2 = 0;
        }
        else {
          lVar2 = cVar1 + 0x2e;
        }
        lVar5 = lVar5 + lVar2;
      }
    }
    part->datasize = lVar5;
  }
  else {
    lVar5 = part->datasize;
  }
  if (part->encoder != (mime_encoder *)0x0) {
    lVar5 = (*part->encoder->sizefunc)(part);
  }
  if ((-1 < lVar5) && ((part->flags & 2) == 0)) {
    sVar3 = slist_size(part->curlheaders,0,(char *)0x0,in_RCX);
    sVar4 = slist_size(part->userheaders,0x5ddf8e,(char *)0xc,in_RCX);
    lVar5 = lVar5 + sVar3 + sVar4 + 2;
  }
  return lVar5;
}

Assistant:

curl_off_t Curl_mime_size(curl_mimepart *part)
{
  curl_off_t size;

  if(part->kind == MIMEKIND_MULTIPART)
    part->datasize = multipart_size(part->arg);

  size = part->datasize;

  if(part->encoder)
    size = part->encoder->sizefunc(part);

  if(size >= 0 && !(part->flags & MIME_BODY_ONLY)) {
    /* Compute total part size. */
    size += slist_size(part->curlheaders, 2, NULL, 0);
    size += slist_size(part->userheaders, 2, STRCONST("Content-Type"));
    size += 2;    /* CRLF after headers. */
  }
  return size;
}